

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O3

void slang::
     function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
     ::
     callback_fn<slang::ast::FmtHelpers::formatArgs[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&,bool)::__1>
               (intptr_t callable,char params,unsigned_long params_1,unsigned_long params_2,
               FormatOptions *params_3)

{
  SymbolKind SVar1;
  SourceLocation SVar2;
  undefined8 *puVar3;
  Expression *this;
  EvalContext *this_00;
  Type *pTVar4;
  string *result;
  bool bVar5;
  uint uVar6;
  bitwidth_t bVar7;
  Diagnostic *pDVar8;
  Type *pTVar9;
  SourceLocation SVar10;
  SourceLocation SVar11;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  bVar5 = ast::formatSpecialArg
                    (params,*(Scope **)(*(long *)callable + 8),*(string **)(callable + 8));
  if (bVar5) {
    return;
  }
  SVar2 = *(SourceLocation *)(*(undefined8 **)(callable + 0x10))[1];
  SVar11 = (SourceLocation)(params_1 * 0x10000000 + (long)SVar2);
  SVar10 = (SourceLocation)(params_2 * 0x10000000 + (long)SVar11);
  if (*(char *)**(undefined8 **)(callable + 0x10) == '\0') {
    SVar10 = SVar2;
    SVar11 = SVar2;
  }
  puVar3 = (undefined8 *)**(long **)(callable + 0x18);
  if (puVar3 == (undefined8 *)((*(long **)(callable + 0x20))[1] * 8 + **(long **)(callable + 0x20)))
  {
    range.endLoc = SVar10;
    range.startLoc = SVar11;
    pDVar8 = ast::EvalContext::addDiag(*(EvalContext **)(callable + 0x28),(DiagCode)0x12000b,range);
    Diagnostic::operator<<(pDVar8,params);
    goto LAB_00418b48;
  }
  **(long **)(callable + 0x18) = (long)(puVar3 + 1);
  this = (Expression *)*puVar3;
  this_00 = *(EvalContext **)(callable + 0x28);
  if (this->kind == EmptyArgument) {
    pDVar8 = ast::EvalContext::addDiag(this_00,(DiagCode)0x10000b,this->sourceRange);
    goto LAB_00418b00;
  }
  bVar5 = ast::Expression::bad(this);
  if (bVar5) goto LAB_00418b48;
  pTVar4 = (this->type).ptr;
  uVar6 = tolower((int)params);
  switch(uVar6 & 0xff) {
  case 0x62:
  case 99:
  case 100:
  case 0x68:
  case 0x6f:
  case 0x78:
    bVar5 = ast::Type::isIntegral(pTVar4);
    if (bVar5) goto LAB_00418c27;
    pTVar9 = pTVar4->canonical;
    if (pTVar9 == (Type *)0x0) {
      ast::Type::resolveCanonical(pTVar4);
      pTVar9 = pTVar4->canonical;
    }
    SVar1 = (pTVar9->super_Symbol).kind;
    if (SVar1 == StringType) goto LAB_00418c27;
    if (SVar1 == FloatingType) {
      pDVar8 = ast::EvalContext::addDiag(this_00,(DiagCode)0x2d000b,this->sourceRange);
      pDVar8 = Diagnostic::operator<<(pDVar8,params);
      goto LAB_00418bf0;
    }
    break;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x74:
    bVar5 = ast::Type::isNumeric(pTVar4);
    goto LAB_00418c1f;
  case 0x70:
    pTVar9 = pTVar4->canonical;
    if (pTVar9 == (Type *)0x0) {
      ast::Type::resolveCanonical(pTVar4);
      pTVar9 = pTVar4->canonical;
    }
    if ((pTVar9->super_Symbol).kind != VoidType) goto LAB_00418c27;
    break;
  case 0x73:
    bVar5 = ast::Type::canBeStringLike(pTVar4);
    goto LAB_00418c1f;
  case 0x75:
  case 0x7a:
    bVar5 = ast::isValidForRaw(pTVar4);
LAB_00418c1f:
    if (bVar5 != false) {
LAB_00418c27:
      ast::Expression::eval((ConstantValue *)&local_58,this,*(EvalContext **)(callable + 0x28));
      if (local_58._M_index == '\0') {
        **(undefined1 **)(callable + 0x30) = 0;
      }
      else {
        result = *(string **)(callable + 8);
        pTVar4 = (this->type).ptr;
        bVar5 = ast::Expression::isImplicitString(this);
        ast::SFormat::formatArg(result,(ConstantValue *)&local_58,pTVar4,params,params_3,bVar5);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      return;
    }
    break;
  case 0x76:
    bVar5 = ast::Type::isIntegral(pTVar4);
    if (bVar5) {
      bVar7 = ast::Type::getBitWidth(pTVar4);
      if (bVar7 < 2) goto LAB_00418c27;
      pDVar8 = ast::EvalContext::addDiag(this_00,(DiagCode)0x2c000b,this->sourceRange);
LAB_00418bf0:
      range_01.endLoc = SVar10;
      range_01.startLoc = SVar11;
      Diagnostic::operator<<(pDVar8,range_01);
      goto LAB_00418c27;
    }
  }
  pDVar8 = ast::EvalContext::addDiag(this_00,(DiagCode)0x11000b,this->sourceRange);
  pDVar8 = ast::operator<<(pDVar8,pTVar4);
LAB_00418b00:
  pDVar8 = Diagnostic::operator<<(pDVar8,params);
  range_00.endLoc = SVar10;
  range_00.startLoc = SVar11;
  Diagnostic::operator<<(pDVar8,range_00);
LAB_00418b48:
  **(undefined1 **)(callable + 0x30) = 0;
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }